

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O0

void invalid_deserialize_test(void *data,size_t size,char *description)

{
  _Bool _Var1;
  char **file;
  roaring_bitmap_t *prVar2;
  char *in_RDX;
  char **in_RSI;
  roaring_bitmap_t *in_RDI;
  roaring_bitmap_t *bitmap;
  size_t serialized_size;
  size_t in_stack_ffffffffffffffd8;
  int line;
  char *in_stack_ffffffffffffffe0;
  
  file = (char **)roaring_bitmap_portable_deserialize_size
                            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (file != in_RSI) {
    print_error("ERROR: expected size %zu, got %zu\n",in_RSI,file);
    _fail((char *)file,(int)(in_stack_ffffffffffffffd8 >> 0x20));
  }
  roaring_bitmap_portable_deserialize_size((char *)file,in_stack_ffffffffffffffd8);
  _assert_int_equal((unsigned_long)in_RSI,(unsigned_long)in_RDX,(char *)file,
                    (int)(in_stack_ffffffffffffffd8 >> 0x20));
  prVar2 = roaring_bitmap_portable_deserialize_safe((char *)in_RDI,(size_t)in_RSI);
  if (prVar2 != (roaring_bitmap_t *)0x0) {
    _Var1 = roaring_bitmap_internal_validate(in_RDI,in_RSI);
    line = (int)((ulong)prVar2 >> 0x20);
    if (_Var1) {
      print_error("ERROR: Validation must fail if a bitmap was returned, %s\n",in_RDX);
      _fail((char *)file,line);
    }
    roaring_bitmap_free((roaring_bitmap_t *)0x103109);
  }
  prVar2 = roaring_bitmap_portable_deserialize_safe((char *)in_RDI,(size_t)in_RSI);
  _assert_true((unsigned_long)in_RSI,in_RDX,(char *)file,(int)((ulong)prVar2 >> 0x20));
  return;
}

Assistant:

static void invalid_deserialize_test(const void* data, size_t size,
                                     const char* description) {
    // Ensure that the data _looks_ like a valid bitmap, but is not.
    size_t serialized_size =
        roaring_bitmap_portable_deserialize_size(data, size);
    if (serialized_size != size) {
        fail_msg("expected size %zu, got %zu", size, serialized_size);
    }
    // If we truncate the data by one byte, we should get a size of 0
    assert_int_equal(roaring_bitmap_portable_deserialize_size(data, size - 1),
                     0);
    roaring_bitmap_t* bitmap =
        roaring_bitmap_portable_deserialize_safe(data, size);
    if (bitmap != NULL) {
        if (roaring_bitmap_internal_validate(bitmap, NULL)) {
            fail_msg("Validation must fail if a bitmap was returned, %s",
                     description);
        }
        roaring_bitmap_free(bitmap);
    }
    // Truncated data will never return a bitmap
    bitmap = roaring_bitmap_portable_deserialize_safe(data, size - 1);
    assert_null(bitmap);
}